

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O1

char * __thiscall soul::PrimitiveType::getDescription(PrimitiveType *this)

{
  uint uVar1;
  
  uVar1 = this->type - void_;
  if (uVar1 < 9) {
    return *(char **)(&DAT_002d4298 + (ulong)uVar1 * 8);
  }
  return "<unknown>";
}

Assistant:

const char* PrimitiveType::getDescription() const
{
    switch (type)
    {
        case Primitive::void_:          return "void";
        case Primitive::float32:        return "float32";
        case Primitive::float64:        return "float64";
        case Primitive::fixed:          return "fixed";
        case Primitive::complex32:      return "complex32";
        case Primitive::complex64:      return "complex64";
        case Primitive::int32:          return "int32";
        case Primitive::int64:          return "int64";
        case Primitive::bool_:          return "bool";
        default:                        return "<unknown>";
    }
}